

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::make_string<char_const(&)[25],char*&,char_const(&)[15],int>
          (string *__return_storage_ptr__,util *this,char (*args) [25],char **args_1,
          char (*args_2) [15],int *args_3)

{
  char *__s;
  size_t sVar1;
  ostringstream ss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar1);
  __s = *(char **)*args;
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  }
  sVar1 = strlen((char *)args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)args_1,sVar1);
  std::ostream::operator<<((ostream *)local_1a8,*(int *)*args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}